

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackCall_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,string *prefix)

{
  FieldDef *__rhs;
  StructDef *struct_def_00;
  long *plVar1;
  size_type *psVar2;
  pointer ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  CSharpGenerator *local_40;
  StructDef *local_38;
  
  ppFVar3 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = prefix;
    local_40 = this;
    local_38 = struct_def;
    do {
      __rhs = *ppFVar3;
      struct_def_00 = (__rhs->value).type.struct_def;
      if (struct_def_00 == (StructDef *)0x0) {
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_88,local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_001c8aba;
      }
      else {
        std::operator+(&local_88,local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar2 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_60.field_2._M_allocated_capacity = *psVar2;
          local_60.field_2._8_8_ = plVar1[3];
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        }
        else {
          local_60.field_2._M_allocated_capacity = *psVar2;
          local_60._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_60._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        GenStructPackCall_ObjectAPI(local_40,struct_def_00,code_ptr,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_001c8aba:
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar3 = ppFVar3 + 1;
    } while (ppFVar3 !=
             (local_38->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string *code_ptr,
                                   std::string prefix) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code_ptr,
                                    prefix + field.name + "_");
      } else {
        code += ",\n";
        code += prefix + field.name;
      }
    }
  }